

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# member_function_pointer_kernel_1.h
# Opt level: O1

void __thiscall
dlib::mfp_kernel_1_base_class<0UL>::swap
          (mfp_kernel_1_base_class<0UL> *this,mfp_kernel_1_base_class<0UL> *item)

{
  long *plVar1;
  mfp_kernel_1_base_class<0UL> temp;
  long local_58 [6];
  long *local_28;
  
  local_28 = local_58;
  (**(code **)(*(item->mp_memory).data + 0x10))();
  (*(code *)**(item->mp_memory).data)();
  plVar1 = (long *)(this->mp_memory).data;
  (**(code **)(*plVar1 + 0x10))(plVar1,(item->mp_memory).data);
  (*(code *)**(this->mp_memory).data)();
  (**(code **)(*local_28 + 0x10))(local_28,(this->mp_memory).data);
  (**(code **)*local_28)();
  return;
}

Assistant:

void swap (
            mfp_kernel_1_base_class& item
        ) 
        {  
            // make a temp copy of item
            mfp_kernel_1_base_class temp(item);

            // destory the stuff in item
            item.destroy_mp_memory();
            // copy *this into item
            mp()->clone(item.mp_memory.get());

            // destory the stuff in this 
            destroy_mp_memory();
            // copy temp into *this
            temp.mp()->clone(mp_memory.get());
        }